

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O0

void do_time(CHAR_DATA *ch,char *argument)

{
  int iVar1;
  char *pcVar2;
  char *time;
  int day;
  char *suf;
  char buf [4608];
  CHAR_DATA *ch_00;
  char *txt;
  char *local_1260;
  uint local_1254;
  char *local_1230;
  char local_1228 [4544];
  char *in_stack_ffffffffffffff98;
  
  iVar1 = time_info.day + 1;
  if ((iVar1 < 5) || (0x13 < iVar1)) {
    if (iVar1 % 10 == 1) {
      local_1230 = "st";
    }
    else if (iVar1 % 10 == 2) {
      local_1230 = "nd";
    }
    else if (iVar1 % 10 == 3) {
      local_1230 = "rd";
    }
    else {
      local_1230 = "th";
    }
  }
  else {
    local_1230 = "th";
  }
  pcVar2 = "";
  if (time_info.half) {
    pcVar2 = "half past ";
  }
  if (time_info.hour % 0xc == 0) {
    local_1254 = 0xc;
  }
  else {
    local_1254 = time_info.hour % 0xc;
  }
  if (time_info.hour < 0xc) {
    local_1260 = "am";
  }
  else {
    local_1260 = "pm";
  }
  ch_00 = (CHAR_DATA *)month_name[time_info.month];
  txt = season_name[time_info.season];
  sprintf(local_1228,
          "It is %s%d o\'clock %s, Day %s, %d%s of the Month %s.\n\rIt is the Season %s in the Year %d.\n\r"
          ,pcVar2,(ulong)local_1254,local_1260,day_name[iVar1 % 6],iVar1,local_1230,ch_00,txt,
          time_info.year);
  send_to_char(txt,ch_00);
  pcVar2 = talloc_string(in_stack_ffffffffffffff98);
  chomp(pcVar2);
  sprintf(local_1228,"Riftshadow started up at %s.\n\r",pcVar2);
  send_to_char(txt,ch_00);
  ctime(&current_time);
  pcVar2 = talloc_string(in_stack_ffffffffffffff98);
  chomp(pcVar2);
  sprintf(local_1228,"The system time is %s.\n\r",pcVar2);
  send_to_char(txt,ch_00);
  return;
}

Assistant:

void do_time(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH];
	char *suf;

	auto day = time_info.day + 1;

	if (day > 4 && day < 20)
		suf = "th";
	else if (day % 10 == 1)
		suf = "st";
	else if (day % 10 == 2)
		suf = "nd";
	else if (day % 10 == 3)
		suf = "rd";
	else
		suf = "th";

	sprintf(buf, "It is %s%d o'clock %s, Day %s, %d%s of the Month %s.\n\rIt is the Season %s in the Year %d.\n\r",
		(time_info.half) ? "half past " : "",
		(time_info.hour % 12 == 0) ? 12 : time_info.hour % 12,
		time_info.hour >= 12 ? "pm" : "am",
		day_name[day % 6],
		day,
		suf,
		month_name[time_info.month],
		season_name[time_info.season],
		time_info.year);
	send_to_char(buf, ch);

	auto time = talloc_string(str_boot_time);
	chomp(time);

	sprintf(buf, "Riftshadow started up at %s.\n\r", time);
	send_to_char(buf, ch);

	time = talloc_string(ctime(&current_time));
	chomp(time);

	sprintf(buf, "The system time is %s.\n\r", time);
	send_to_char(buf, ch);
}